

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_br89.c
# Opt level: O1

double xc_mgga_x_br89_get_x(double Q)

{
  double dVar1;
  double rhs;
  double local_8;
  
  if (ABS(Q) < 5e-12) {
    return 2.0;
  }
  local_8 = 1.430019598074017 / Q;
  dVar1 = 2.0;
  if (0.0 < local_8) {
    dVar1 = 1.0 / local_8 + 2.0;
  }
  dVar1 = xc_math_brent(br89_x_Q,(double)(-(ulong)(0.0 < local_8) & 0x4000000000000000),dVar1,5e-12,
                        500.0,&local_8);
  return dVar1;
}

Assistant:

GPU_FUNCTION
double xc_mgga_x_br89_get_x(double Q)
{
  double rhs, tol, x1, x2;

  tol = 5e-12;
  if(fabs(Q) < 5e-12)
    return 2.0;

  /* build right-hand side of the non-linear equation
     Remember we use a different definition of tau */
  rhs = 2.0/3.0*pow(M_PI, 2.0/3.0)/Q;

  /* starting interval */
  if(rhs > 0.0) {
    x1 = 2.0;
    x2 = 1.0/rhs + 2.0;
  }else{
    x2 = 2.0;
    x1 = 0.0;
  }

  return xc_math_brent(br89_x_Q, x1, x2, tol, 500, &rhs);
}